

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O2

unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
 __thiscall lrit::File::getDataFromBuffer(File *this)

{
  uint uVar1;
  long lVar2;
  long *this_00;
  long lVar3;
  long in_RSI;
  
  lVar3 = *(long *)(in_RSI + 0x20);
  lVar2 = *(long *)(in_RSI + 0x28);
  uVar1 = *(uint *)(in_RSI + 0x88);
  this_00 = (long *)operator_new(0x158);
  std::ios::ios((ios *)(this_00 + 10));
  *this_00 = (long)&PTR__memstream_00114c40;
  this_00[10] = (long)&PTR__memstream_00114c68;
  std::istream::istream(this_00,(streambuf *)&PTR_construction_vtable_24__00114c80);
  lVar3 = (ulong)uVar1 + lVar3;
  *this_00 = (long)&PTR__memstream_00114c40;
  this_00[10] = (long)&PTR__memstream_00114c68;
  std::streambuf::streambuf((streambuf *)(this_00 + 2));
  this_00[2] = (long)&PTR__streambuf_00114d10;
  this_00[3] = lVar3;
  this_00[4] = lVar3;
  this_00[5] = lVar2;
  std::ios::rdbuf((streambuf *)((long)this_00 + *(long *)(*this_00 + -0x18)));
  (this->file_)._M_dataplus._M_p = (pointer)this_00;
  return (__uniq_ptr_data<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<std::istream> File::getDataFromBuffer() const {
  auto ms = std::make_unique<memstream>(
    buf_.data() + ph_.totalHeaderLength,
    buf_.size() - ph_.totalHeaderLength);
  return std::unique_ptr<std::istream>(ms.release());
}